

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

Abc_Obj_t * Abc_NtkCloneObj(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  long lVar1;
  
  pObj_00 = Abc_NtkCreateObj(pObj->pNtk,
                             *(Abc_ObjType_t *)&pObj->field_0x14 & (ABC_OBJ_LATCH|ABC_OBJ_NODE));
  for (lVar1 = 0; lVar1 < (pObj->vFanins).nSize; lVar1 = lVar1 + 1) {
    Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar1]]);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkCloneObj( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pClone, * pFanin;
    int i;
    pClone = Abc_NtkCreateObj( pObj->pNtk, (Abc_ObjType_t)pObj->Type );   
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pClone, pFanin );
    return pClone;
}